

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>::init
          (BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  undefined4 extraout_var;
  ShaderProgram *pSVar2;
  long lVar3;
  TestError *pTVar4;
  long lVar5;
  long *local_190;
  long local_188;
  long local_180 [2];
  long *local_170;
  long local_168;
  long local_160 [2];
  uint local_150;
  value_type local_148;
  uint local_128;
  value_type local_120;
  undefined1 local_100 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_useGL == true) {
    pSVar2 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    memset(local_100,0,0xac);
    local_170 = local_160;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,
               "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
               ,"");
    local_128 = 0;
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_170,local_168 + (long)local_170);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_128 * 0x18),&local_120);
    local_190 = local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,
               "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nvoid main (void)\n{\n\tdEQP_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
               ,"");
    local_150 = 1;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_190,local_188 + (long)local_190);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_150 * 0x18),&local_148);
    glu::ShaderProgram::ShaderProgram(pSVar2,renderCtx,(ProgramSources *)local_100);
    this->m_dummyProgram = pSVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_190 != local_180) {
      operator_delete(local_190,local_180[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_170 != local_160) {
      operator_delete(local_170,local_160[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    pSVar2 = this->m_dummyProgram;
    if ((pSVar2->m_program).m_info.linkOk == false) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar2
                     );
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"failed to build shader program","");
      tcu::TestError::TestError(pTVar4,(string *)local_100);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar3 = (**(code **)(lVar3 + 0x780))((pSVar2->m_program).m_program,"a_position");
    this->m_dummyProgramPosLoc = (int)lVar3;
    if ((int)lVar3 == -1) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"a_position location was -1","");
      tcu::TestError::TestError(pTVar4,(string *)local_100);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return (int)lVar3;
}

Assistant:

void BasicBufferCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!m_useGL)
		return;

	// \note Viewport size is not checked, it won't matter if the render target actually is smaller hhan DUMMY_RENDER_AREA_SIZE

	// dummy shader

	m_dummyProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_dummyVertexShader) << glu::FragmentSource(s_dummyFragnentShader));
	if (!m_dummyProgram->isOk())
	{
		m_testCtx.getLog() << *m_dummyProgram;
		throw tcu::TestError("failed to build shader program");
	}

	m_dummyProgramPosLoc = gl.getAttribLocation(m_dummyProgram->getProgram(), "a_position");
	if (m_dummyProgramPosLoc == -1)
		throw tcu::TestError("a_position location was -1");
}